

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sym.cpp
# Opt level: O2

StackSym * StackSym::New(SymID id,IRType type,RegSlot byteCodeRegSlot,Func *func)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  StackSym *newSym;
  Sym *pSVar5;
  undefined4 *puVar6;
  
  if (byteCodeRegSlot == 0xffffffff) {
    newSym = (StackSym *)
             new<Memory::ArenaAllocator>(0x50,&func->m_alloc->super_ArenaAllocator,0x35b3c0);
    (newSym->super_Sym).m_next = (Sym *)0x0;
    (newSym->super_Sym).m_id = 0;
    (newSym->super_Sym).m_kind = SymKindInvalid;
    *(undefined3 *)&(newSym->super_Sym).field_0x15 = 0;
    *(undefined8 *)&newSym->field_0x18 = 0;
    newSym->m_offset = 0;
    newSym->m_argPosition = 0;
    (newSym->field_5).m_instrDef = (Instr *)0x0;
    newSym->m_tempNumberSym = (StackSym *)0x0;
    newSym->m_equivNext = (StackSym *)0x0;
    newSym->m_objectInfo = (ObjectSymInfo *)0x0;
    newSym->scratch = (anon_union_8_3_6c1fdb8e_for_scratch)0x0;
    (newSym->super_Sym)._vptr_Sym = (_func_int **)&PTR_DummyVirtualFunc_01375530;
    iVar4 = 1;
  }
  else {
    newSym = (StackSym *)
             new<Memory::ArenaAllocator>(0x60,&func->m_alloc->super_ArenaAllocator,0x35b3c0);
    (newSym->m_builtInIndex)._value = '\0';
    (newSym->super_Sym)._vptr_Sym = (_func_int **)&PTR_DummyVirtualFunc_01375518;
    *(RegSlot *)&newSym[1].super_Sym._vptr_Sym = byteCodeRegSlot;
    newSym[1].super_Sym.m_next = (Sym *)func;
    uVar1 = *(uint *)&newSym->field_0x18;
    *(uint *)&newSym->field_0x18 = uVar1 | 0x2000;
    iVar4 = (uVar1 & 0xe00ce206 | 0x2000) + 1;
  }
  (newSym->super_Sym).m_id = id;
  (newSym->super_Sym).m_kind = SymKindStack;
  *(int *)&newSym->field_0x18 = iVar4;
  (newSym->m_builtInIndex)._value = 'H';
  *(undefined2 *)&(newSym->super_Sym).field_0x16 = 0xffff;
  newSym->m_type = type;
  newSym->m_equivNext = newSym;
  newSym->m_objectInfo = (ObjectSymInfo *)0x0;
  pSVar5 = SymTable::Find(func->m_symTable,id);
  if (pSVar5 != (Sym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                       ,0x42,"(func->m_symTable->Find(id) == nullptr)",
                       "Trying to add new symbol which already exists.");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  SymTable::Add(func->m_symTable,&newSym->super_Sym);
  return newSym;
}

Assistant:

StackSym *
StackSym::New(SymID id, IRType type, Js::RegSlot byteCodeRegSlot, Func *func)
{
    StackSym * stackSym;

    if (byteCodeRegSlot != Js::Constants::NoRegister)
    {
        stackSym = AnewZ(func->m_alloc, ByteCodeStackSym, byteCodeRegSlot, func);
        stackSym->m_hasByteCodeRegSlot = true;
    }
    else
    {
        stackSym = AnewZ(func->m_alloc, StackSym);
    }

    stackSym->m_id = id;
    stackSym->m_kind = SymKindStack;

    // Assume SingleDef until proven false.

    stackSym->m_isConst = false;
    stackSym->m_isIntConst = false;
    stackSym->m_isTaggableIntConst = false;
    stackSym->m_isSingleDef = true;
    stackSym->m_isEncodedConstant = false;
    stackSym->m_isFltConst = false;
    stackSym->m_isInt64Const = false;
    stackSym->m_isStrConst = false;
    stackSym->m_isStrEmpty = false;
    stackSym->m_allocated = false;
    stackSym->m_isTypeSpec = false;
    stackSym->m_isArgSlotSym = false;
    stackSym->m_isArgSlotRegSym = false;
    stackSym->m_nonEscapingArgObjAlias = false;
    stackSym->m_isParamSym = false;
    stackSym->m_isImplicitParamSym = false;
    stackSym->m_isBailOutReferenced = false;
    stackSym->m_isArgCaptured = false;
    stackSym->m_requiresBailOnNotNumber = false;
    stackSym->m_isCatchObjectSym = false;
    stackSym->m_isClosureSym = false;
    stackSym->m_builtInIndex = Js::BuiltinFunction::None;
    stackSym->m_slotNum = StackSym::InvalidSlot;

    stackSym->m_type = type;
    stackSym->m_equivNext = stackSym;
    stackSym->m_objectInfo = nullptr;

    AssertMsg(func->m_symTable->Find(id) == nullptr, "Trying to add new symbol which already exists.");
    func->m_symTable->Add(stackSym);

    return stackSym;
}